

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O3

int Gia_ManBmciTest(Gia_Man_t *p,Vec_Int_t *vInit,int nFrames,int nWords,int nTimeOut,int fSim,
                   int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vInit1;
  int *__s;
  int nWords_00;
  
  iVar1 = p->nRegs;
  nWords_00 = nTimeOut;
  vInit1 = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar2 = iVar1;
  }
  vInit1->nCap = iVar2;
  if (iVar2 == 0) {
    vInit1->pArray = (int *)0x0;
    vInit1->nSize = iVar1;
  }
  else {
    __s = (int *)malloc((long)iVar2 << 2);
    vInit1->pArray = __s;
    vInit1->nSize = iVar1;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)iVar1 << 2);
      Bmc_BmciPerform(p,vInit,vInit1,nFrames,nWords_00,nTimeOut,fVerbose);
      free(__s);
      goto LAB_00572d8b;
    }
  }
  Bmc_BmciPerform(p,vInit,vInit1,nFrames,nWords_00,nTimeOut,fVerbose);
LAB_00572d8b:
  free(vInit1);
  return 1;
}

Assistant:

int Gia_ManBmciTest( Gia_Man_t * p, Vec_Int_t * vInit, int nFrames, int nWords, int nTimeOut, int fSim, int fVerbose )
{
    Vec_Int_t * vInit0 = Vec_IntStart( Gia_ManRegNum(p) );
    Bmc_BmciPerform( p, vInit, vInit0, nFrames, nWords, nTimeOut, fVerbose );
    Vec_IntFree( vInit0 );
    return 1;
}